

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipedFootContactClassifier.cpp
# Opt level: O0

void __thiscall
iDynTree::BipedFootContactClassifier::updateFootContactState
          (BipedFootContactClassifier *this,double currentTime,double leftFootNormalForce,
          double rightFootNormalForce)

{
  bool bVar1;
  pointer pCVar2;
  long in_RDI;
  BipedFootContactClassifier *in_XMM0_Qa;
  double in_XMM1_Qa;
  unique_ptr<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
  *in_XMM2_Qa;
  
  std::
  unique_ptr<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>::
  get(in_XMM2_Qa);
  ContactStateMachine::contactMeasurementUpdate
            ((ContactStateMachine *)in_XMM0_Qa,in_XMM1_Qa,(double)in_XMM2_Qa);
  std::
  unique_ptr<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>::
  get(in_XMM2_Qa);
  ContactStateMachine::contactMeasurementUpdate
            ((ContactStateMachine *)in_XMM0_Qa,in_XMM1_Qa,(double)in_XMM2_Qa);
  pCVar2 = std::
           unique_ptr<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
           ::get(in_XMM2_Qa);
  bVar1 = ContactStateMachine::contactState(pCVar2);
  *(bool *)(in_RDI + 0x14) = bVar1;
  pCVar2 = std::
           unique_ptr<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
           ::get(in_XMM2_Qa);
  bVar1 = ContactStateMachine::contactState(pCVar2);
  *(bool *)(in_RDI + 0x15) = bVar1;
  detectFeetTransition(in_XMM0_Qa);
  return;
}

Assistant:

void BipedFootContactClassifier::updateFootContactState(double currentTime, double leftFootNormalForce, double rightFootNormalForce)
{
    m_leftFootContactClassifier.get()->contactMeasurementUpdate(currentTime, leftFootNormalForce);
    m_rightFootContactClassifier.get()->contactMeasurementUpdate(currentTime, rightFootNormalForce);
    m_leftFootContactState = m_leftFootContactClassifier.get()->contactState();
    m_rightFootContactState = m_rightFootContactClassifier.get()->contactState();
    
    detectFeetTransition();
}